

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void suboption(connectdata *conn)

{
  char cVar1;
  SessionHandle *data_00;
  HTTP *pHVar2;
  char *pcVar3;
  size_t sVar4;
  ssize_t sVar5;
  uint *puVar6;
  undefined8 in_stack_fffffffffffff688;
  uint uVar7;
  TELNET *tn;
  SessionHandle *data;
  char varval [128];
  char varname [128];
  int err;
  size_t tmplen;
  size_t len;
  ssize_t bytes_written;
  uchar temp [2048];
  curl_slist *v;
  connectdata *conn_local;
  
  uVar7 = (uint)((ulong)in_stack_fffffffffffff688 >> 0x20);
  data_00 = conn->data;
  pHVar2 = (data_00->state).proto.http;
  printsub(data_00,0x3c,(uchar *)&pHVar2[0x36].postsize,
           (*(long *)&pHVar2[0x39].sending - pHVar2[0x39].backup.postsize) + 2);
  pcVar3 = (char *)pHVar2[0x39].backup.postsize;
  pHVar2[0x39].backup.postsize = (curl_off_t)(pcVar3 + 1);
  cVar1 = *pcVar3;
  if (cVar1 == '\x18') {
    sVar4 = strlen((char *)&pHVar2[0x34].backup.postdata);
    curl_msnprintf((char *)&bytes_written,0x800,"%c%c%c%c%s%c%c",0xff,0xfa,0x18,(ulong)uVar7 << 0x20
                   ,&pHVar2[0x34].backup.postdata,0xff,0xf0);
    sVar5 = send(conn->sock[0],&bytes_written,sVar4 + 6,0x4000);
    if (sVar5 < 0) {
      puVar6 = (uint *)__errno_location();
      Curl_failf(data_00,"Sending data failed (%d)",(ulong)*puVar6);
    }
    printsub(data_00,0x3e,(uchar *)((long)&bytes_written + 2),sVar4 + 4);
  }
  else if (cVar1 == '#') {
    sVar4 = strlen((char *)(pHVar2 + 0x35));
    curl_msnprintf((char *)&bytes_written,0x800,"%c%c%c%c%s%c%c",0xff,0xfa,0x23,(ulong)uVar7 << 0x20
                   ,pHVar2 + 0x35,0xff,0xf0);
    sVar5 = send(conn->sock[0],&bytes_written,sVar4 + 6,0x4000);
    if (sVar5 < 0) {
      puVar6 = (uint *)__errno_location();
      Curl_failf(data_00,"Sending data failed (%d)",(ulong)*puVar6);
    }
    printsub(data_00,0x3e,(uchar *)((long)&bytes_written + 2),sVar4 + 4);
  }
  else if (cVar1 == '\'') {
    curl_msnprintf((char *)&bytes_written,0x800,"%c%c%c%c",0xff,0xfa,0x27,(ulong)uVar7 << 0x20);
    tmplen = 4;
    for (temp._2040_8_ = pHVar2[0x36].sendit; temp._2040_8_ != 0;
        temp._2040_8_ = *(undefined8 *)(temp._2040_8_ + 8)) {
      sVar4 = strlen(*(char **)temp._2040_8_);
      if (tmplen + sVar4 + 1 < 0x7fa) {
        __isoc99_sscanf(*(undefined8 *)temp._2040_8_,"%127[^,],%127s",varval + 0x78,&data);
        curl_msnprintf((char *)(temp + (tmplen - 8)),0x800 - tmplen,"%c%s%c%s",0,varval + 0x78,1,
                       &data);
        tmplen = sVar4 + 1 + tmplen;
      }
    }
    curl_msnprintf((char *)(temp + (tmplen - 8)),0x800 - tmplen,"%c%c",0xff,0xf0);
    sVar5 = send(conn->sock[0],&bytes_written,tmplen + 2,0x4000);
    if (sVar5 < 0) {
      puVar6 = (uint *)__errno_location();
      Curl_failf(data_00,"Sending data failed (%d)",(ulong)*puVar6);
    }
    printsub(data_00,0x3e,(uchar *)((long)&bytes_written + 2),tmplen);
  }
  return;
}

Assistant:

static void suboption(struct connectdata *conn)
{
  struct curl_slist *v;
  unsigned char temp[2048];
  ssize_t bytes_written;
  size_t len;
  size_t tmplen;
  int err;
  char varname[128];
  char varval[128];
  struct SessionHandle *data = conn->data;
  struct TELNET *tn = (struct TELNET *)data->state.proto.telnet;

  printsub(data, '<', (unsigned char *)tn->subbuffer, CURL_SB_LEN(tn)+2);
  switch (CURL_SB_GET(tn)) {
    case CURL_TELOPT_TTYPE:
      len = strlen(tn->subopt_ttype) + 4 + 2;
      snprintf((char *)temp, sizeof(temp),
               "%c%c%c%c%s%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_TTYPE,
               CURL_TELQUAL_IS, tn->subopt_ttype, CURL_IAC, CURL_SE);
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
    case CURL_TELOPT_XDISPLOC:
      len = strlen(tn->subopt_xdisploc) + 4 + 2;
      snprintf((char *)temp, sizeof(temp),
               "%c%c%c%c%s%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_XDISPLOC,
               CURL_TELQUAL_IS, tn->subopt_xdisploc, CURL_IAC, CURL_SE);
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
    case CURL_TELOPT_NEW_ENVIRON:
      snprintf((char *)temp, sizeof(temp),
               "%c%c%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_NEW_ENVIRON,
               CURL_TELQUAL_IS);
      len = 4;

      for(v = tn->telnet_vars;v;v = v->next) {
        tmplen = (strlen(v->data) + 1);
        /* Add the variable only if it fits */
        if(len + tmplen < (int)sizeof(temp)-6) {
          sscanf(v->data, "%127[^,],%127s", varname, varval);
          snprintf((char *)&temp[len], sizeof(temp) - len,
                   "%c%s%c%s", CURL_NEW_ENV_VAR, varname,
                   CURL_NEW_ENV_VALUE, varval);
          len += tmplen;
        }
      }
      snprintf((char *)&temp[len], sizeof(temp) - len,
               "%c%c", CURL_IAC, CURL_SE);
      len += 2;
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
  }
  return;
}